

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_> *
libcellml::getImportedUnits
          (vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
           *__return_storage_ptr__,ModelConstPtr *model)

{
  bool bVar1;
  element_type *peVar2;
  size_t sVar3;
  element_type *peVar4;
  UnitsPtr units;
  ulong local_28;
  size_t i;
  ModelConstPtr *model_local;
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  *importedUnits;
  
  std::
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>::
  vector(__return_storage_ptr__);
  local_28 = 0;
  while( true ) {
    peVar2 = std::
             __shared_ptr_access<const_libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)model);
    sVar3 = Model::unitsCount(peVar2);
    if (sVar3 <= local_28) break;
    peVar2 = std::
             __shared_ptr_access<const_libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)model);
    Model::units((Model *)&stack0xffffffffffffffb8,(size_t)peVar2);
    peVar4 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&stack0xffffffffffffffb8);
    bVar1 = ImportedEntity::isImport(&peVar4->super_ImportedEntity);
    if (bVar1) {
      std::
      vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&stack0xffffffffffffffb8);
    }
    std::shared_ptr<libcellml::Units>::~shared_ptr
              ((shared_ptr<libcellml::Units> *)&stack0xffffffffffffffb8);
    local_28 = local_28 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<UnitsPtr> getImportedUnits(const ModelConstPtr &model)
{
    std::vector<UnitsPtr> importedUnits;
    for (size_t i = 0; i < model->unitsCount(); ++i) {
        auto units = model->units(i);
        if (units->isImport()) {
            importedUnits.push_back(units);
        }
    }

    return importedUnits;
}